

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O3

int __thiscall Backpack::remove(Backpack *this,char *__filename)

{
  pointer ppBVar1;
  void *pvVar2;
  pointer ppBVar3;
  
  pvVar2 = (void *)((ulong)__filename & 0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"class:Backpack method:remove\n",0x1d);
  if (0 < (int)__filename) {
    ppBVar1 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppBVar3 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2 <= (void *)((long)ppBVar3 - (long)ppBVar1 >> 3)) {
      ppBVar1 = ppBVar1 + (long)pvVar2;
      if (ppBVar1 != ppBVar3) {
        pvVar2 = memmove(ppBVar1 + -1,ppBVar1,(long)ppBVar3 - (long)ppBVar1);
        ppBVar3 = (this->backpack).
                  super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppBVar3 + -1;
      return (int)CONCAT71((int7)((ulong)pvVar2 >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool Backpack::remove(int index) {
    std::cout << "class:Backpack method:remove\n";
    if (index <= 0 || index > backpack.size()) {
        return false;
    }
    backpack.erase(backpack.begin() + index - 1);
    return true;
}